

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_set_target_rate(AV1_COMP *cpi,int width,int height)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = (cpi->rc).base_frame_target;
  uVar8 = (ulong)uVar1;
  if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
    pAVar2 = cpi->ppi;
    pFVar3 = ((pAVar2->twopass).stats_buf_ctx)->total_stats;
    if (pFVar3 == (FIRSTPASS_STATS *)0x0) {
      dVar12 = 0.0;
    }
    else {
      dVar12 = pFVar3->count;
    }
    uVar10 = (ulong)(int)uVar1;
    dVar12 = dVar12 - (double)(cpi->common).current_frame.frame_number;
    dVar13 = 16.0;
    if (dVar12 <= 16.0) {
      dVar13 = dVar12;
    }
    if (0 < (int)dVar13) {
      lVar4 = (pAVar2->p_rc).vbr_bits_off_target;
      lVar5 = lVar4 / (long)(ulong)(uint)(int)dVar13;
      lVar6 = -lVar5;
      if (0 < lVar5) {
        lVar6 = lVar5;
      }
      lVar5 = (long)uVar10 / 2;
      if (lVar6 < (long)uVar10 / 2) {
        lVar5 = lVar6;
      }
      lVar6 = -lVar5;
      if (-1 < lVar4) {
        lVar6 = lVar5;
      }
      uVar10 = uVar10 + lVar6;
    }
    if ((((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
         (((pAVar2->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)) &&
        (uVar8 = (pAVar2->p_rc).vbr_bits_off_target_fast, uVar8 != 0)) &&
       ((cpi->rc).is_src_frame_alt_ref == 0)) {
      uVar7 = (ulong)(cpi->rc).avg_frame_bandwidth;
      if ((long)uVar7 < (long)uVar10) {
        uVar7 = uVar10;
      }
      uVar9 = uVar7;
      if ((long)uVar8 < (long)uVar7) {
        uVar9 = uVar8;
      }
      uVar11 = uVar7 + 7;
      if (-1 < (long)uVar7) {
        uVar11 = uVar7;
      }
      uVar7 = uVar8 + 7;
      if (-1 < (long)uVar8) {
        uVar7 = uVar8;
      }
      uVar8 = (long)uVar7 >> 3;
      if ((long)uVar7 >> 3 < (long)uVar11 >> 3) {
        uVar8 = (long)uVar11 >> 3;
      }
      if ((long)uVar9 < (long)uVar8) {
        uVar8 = uVar9;
      }
      if (0x7ffffffe < (long)uVar8) {
        uVar8 = 0x7fffffff;
      }
      uVar7 = 0;
      if (0 < (long)uVar8) {
        uVar7 = uVar8;
      }
      uVar10 = uVar10 + uVar7;
      (cpi->rc).frame_level_fast_extra_bits = (int)uVar8;
      cpi->do_update_vbr_bits_off_target_fast = 1;
    }
    uVar8 = 0x7fffffff;
    if ((long)uVar10 < 0x7fffffff) {
      uVar8 = uVar10;
    }
  }
  av1_rc_set_frame_target(cpi,(int)uVar8,width,height);
  return;
}

Assistant:

void av1_set_target_rate(AV1_COMP *cpi, int width, int height) {
  RATE_CONTROL *const rc = &cpi->rc;
  int target_rate = rc->base_frame_target;

  // Correction to rate target based on prior over or under shoot.
  if (cpi->oxcf.rc_cfg.mode == AOM_VBR || cpi->oxcf.rc_cfg.mode == AOM_CQ)
    vbr_rate_correction(cpi, &target_rate);
  av1_rc_set_frame_target(cpi, target_rate, width, height);
}